

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O1

int bfgs_min2(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
             double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
             double xtol,double *xf)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *xi_00;
  int iVar4;
  double *pdVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  double local_f0;
  double alpha;
  double local_e0;
  double *local_d8;
  double *local_d0;
  custom_gradient *local_c8;
  double *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a0;
  double fxf;
  double local_90;
  double local_88;
  custom_function *local_80;
  double *local_78;
  double local_70;
  undefined1 local_68 [16];
  double *local_58;
  double local_50;
  double *local_48;
  ulong local_40;
  int local_34;
  
  local_40 = CONCAT44(in_register_0000000c,N);
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = fsval;
  local_68._12_4_ = in_XMM0_Dd;
  sVar10 = (long)N * 8;
  alpha = xtol;
  local_e0 = ftol;
  local_c8 = funcgrad;
  local_90 = gtol;
  local_88 = eps;
  local_80 = funcpt;
  local_50 = maxstep;
  pdVar5 = (double *)malloc(sVar10);
  local_58 = (double *)malloc(sVar10);
  local_78 = (double *)malloc(sVar10);
  fxf = (double)malloc(sVar10);
  local_48 = (double *)malloc((long)N * sVar10);
  local_d0 = (double *)malloc(sVar10);
  *niter = 0;
  if (local_88 < 0.0) {
    local_70 = sqrt(local_88);
  }
  else {
    local_70 = SQRT(local_88);
  }
  pdVar3 = local_58;
  local_f0 = 1.0;
  if (0 < (int)local_40) {
    uVar6 = 0;
    do {
      xi[uVar6] = dx[uVar6] * xi[uVar6];
      dx[uVar6] = 1.0 / dx[uVar6];
      uVar6 = uVar6 + 1;
    } while ((local_40 & 0xffffffff) != uVar6);
  }
  local_b8 = (*local_80->funcpt)(xi,(int)local_40,local_80->params);
  dVar2 = ABS(local_b8);
  local_34 = 0;
  uStack_b0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  if (1.79769313486232e+308 <= dVar2) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(local_b8)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  iVar7 = (int)local_40;
  iVar4 = grad_fd(local_80,local_c8,xi,iVar7,dx,local_70,pdVar5);
  if (iVar4 == 0xf) {
    local_34 = 0xf;
  }
  if (local_50 <= 0.0) {
    dVar1 = 0.0;
    local_50 = 0.0;
    if (0 < iVar7) {
      uVar6 = 0;
      dVar1 = 0.0;
      do {
        dVar11 = dx[uVar6];
        dVar1 = dVar1 + dVar11 * dVar11;
        local_50 = local_50 + dVar11 * xi[uVar6] * dVar11 * xi[uVar6];
        uVar6 = uVar6 + 1;
      } while ((local_40 & 0xffffffff) != uVar6);
    }
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    if (local_50 < 0.0) {
      dVar11 = local_50;
      local_50 = dVar1;
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(local_50);
      local_50 = dVar1;
    }
    if (dVar11 < local_50) {
      dVar11 = local_50;
    }
    local_50 = dVar11 * 1000.0;
    iVar7 = (int)local_40;
  }
  if (0 < iVar7) {
    dVar1 = dVar2;
    if (dVar2 <= ABS((double)local_68._0_8_)) {
      dVar1 = ABS((double)local_68._0_8_);
    }
    uVar6 = 0;
    do {
      dVar11 = ABS(xi[uVar6]);
      if (ABS(xi[uVar6]) <= 1.0 / ABS(dx[uVar6])) {
        dVar11 = 1.0 / ABS(dx[uVar6]);
      }
      pdVar3[uVar6] = (ABS(pdVar5[uVar6]) * dVar11) / dVar1;
      uVar6 = uVar6 + 1;
    } while ((local_40 & 0xffffffff) != uVar6);
  }
  dVar1 = array_max_abs(pdVar3,(int)local_40);
  if ((dVar1 <= local_90 * 0.001) && (local_34 = 1, 0 < (int)local_40)) {
    uVar6 = 0;
    do {
      xf[uVar6] = xi[uVar6];
      uVar6 = uVar6 + 1;
    } while ((local_40 & 0xffffffff) != uVar6);
  }
  if (dVar2 <= (double)local_68._0_8_) {
    dVar2 = (double)local_68._0_8_;
  }
  local_d8 = pdVar5;
  local_c0 = xi;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  local_68._0_8_ = dVar2;
  pdVar5 = local_48;
  if (0 < (int)local_40) {
    uVar6 = local_40 & 0xffffffff;
    uVar9 = 0;
    sVar10 = 0;
    do {
      *(double *)((long)pdVar5 + (uVar9 & 0xffffffff) * 8 + sVar10) =
           *(double *)((long)dx + sVar10) * (double)local_68._0_8_;
      if (sVar10 != 0) {
        memset(local_48 + uVar9,0,sVar10);
        pdVar5 = local_48;
      }
      sVar10 = sVar10 + 8;
      uVar9 = uVar9 + uVar6;
    } while (uVar6 * 8 - sVar10 != 0);
  }
  uVar6 = local_40;
  uVar8 = (uint)local_40;
  if (0 < (int)uVar8) {
    memcpy(local_78,local_c0,(local_40 & 0xffffffff) << 3);
    pdVar5 = local_48;
  }
  pdVar3 = local_d8;
  iVar4 = local_34;
  local_a0 = local_b8;
  if (local_34 == 0) {
    local_68._0_8_ = (uVar6 & 0xffffffff) << 3;
    do {
      if (MAXITER <= *niter) {
        iVar4 = 4;
        break;
      }
      *niter = *niter + 1;
      iVar4 = (int)uVar6;
      scale(pdVar3,1,iVar4,-1.0);
      linsolve_lower(pdVar5,iVar4,pdVar3,(double *)fxf);
      scale(pdVar3,1,iVar4,-1.0);
      pdVar5 = local_d0;
      if (0 < iVar4) {
        memcpy(local_d0,pdVar3,local_68._0_8_);
      }
      uVar6 = local_40;
      xi_00 = local_78;
      iVar7 = (int)local_40;
      iVar4 = lnsrchmt(local_80,local_c8,local_78,&local_a0,pdVar3,&local_f0,(double *)fxf,iVar7,dx,
                       local_50,MAXITER,local_70,local_e0,local_90,alpha,xf);
      local_34 = stopcheck2_mt(local_a0,iVar7,local_b8,pdVar3,dx,local_88,local_90,local_e0,iVar4);
      uStack_b0 = 0;
      local_b8 = local_a0;
      bfgs_factored(local_48,iVar7,local_88,xi_00,xf,pdVar5,pdVar3);
      if (0 < iVar7) {
        memcpy(xi_00,xf,local_68._0_8_);
      }
      pdVar5 = local_48;
      iVar4 = local_34;
    } while (local_34 == 0);
    uVar8 = (uint)uVar6;
  }
  pdVar5 = local_58;
  if (0 < (int)uVar8) {
    uVar6 = 0;
    do {
      local_c0[uVar6] = dx[uVar6] * local_c0[uVar6];
      dx[uVar6] = 1.0 / dx[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  free(local_d8);
  free(pdVar5);
  free(local_78);
  free(local_48);
  free((void *)fxf);
  free(local_d0);
  return iVar4;
}

Assistant:

int bfgs_min2(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval, double maxstep, int MAXITER, int *niter,
	double eps, double gtol, double ftol, double xtol, double *xf)  {
	int rcode, gfdcode;
	int i, siter, retval;
	double dt1, dt2;
	double fx, num, den, stop0, fxf, eps2,fo,alpha;
	double *jac, *hess, *scheck, *xc, *L, *step, *jacf;

	jac = (double*)malloc(sizeof(double)*N);
	scheck = (double*)malloc(sizeof(double)*N);
	xc = (double*)malloc(sizeof(double)*N);
	step = (double*)malloc(sizeof(double)*N);
	hess = (double*)malloc(sizeof(double)*N * N);
	L = (double*)malloc(sizeof(double)*N * N);
	jacf = (double*)malloc(sizeof(double)*N);

	/*
	* Return Codes
	*
	* Codes 1,2,3 denote possible success.
	* Codes 0 and 4 denote failure.
	*
	* 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	* 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	* 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	* 4 - Iteration Limit exceeded. Convergence not achieved.
	* 15 -Failure as Inf/Nan Values encountered
	*
	*/

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;

	//set values
	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	fo = fx;

	gfdcode = grad_fd(funcpt, funcgrad, xi, N, dx, eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
		den = fabs(fx);
	}
	else {
		den = fabs(fsval);
	}
	for (i = 0; i < N; ++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		}
		else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck, N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for (i = 0; i < N; ++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L, N, fx, fsval, dx);

	for (i = 0; i < N; ++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac, 1, N, -1.0);

		linsolve_lower(L, N, jac, step);

		scale(jac, 1, N, -1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//retval = lnsrch(funcpt, xc, jac, step, N, dx, maxstep, stol, xf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);

		//rcode = stopcheck(fxf, N, xc, xf, jacf, dx, fsval, gtol, stol, retval);
		rcode = stopcheck2_mt(fxf, N, fo, jac, dx, eps, gtol, ftol, retval);
		fo = fxf;
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L, N, eps, xc, xf, jacf, jac);
		for (i = 0; i < N; ++i) {
			xc[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}

	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}